

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O2

void __thiscall HBT_correlation::calculate_flow_event_plane_angle(HBT_correlation *this,int n_order)

{
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *pvVar1;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double local_50;
  double local_48;
  
  pvVar1 = ((this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->particle_list;
  uVar6 = (ulong)((long)(pvVar1->
                        super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar1->
                       super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar7 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar7 = 0;
  }
  local_48 = 0.0;
  local_50 = 0.0;
  for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
    pvVar2 = (((this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->particle_list->
             super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             )._M_impl.super__Vector_impl_data._M_start[uVar6];
    uVar4 = ((long)*(pointer *)
                    ((long)&pvVar2->
                            super__Vector_base<particle_info,_std::allocator<particle_info>_> + 8) -
            *(long *)&pvVar2->super__Vector_base<particle_info,_std::allocator<particle_info>_>) /
            0x78;
    uVar5 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar5 = 0;
    }
    for (lVar8 = 0; uVar5 * 0x78 - lVar8 != 0; lVar8 = lVar8 + 0x78) {
      lVar3 = *(long *)&(((this->particle_list).
                          super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         particle_list->
                        super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar6]->
                        super__Vector_base<particle_info,_std::allocator<particle_info>_>;
      dVar9 = atan2(*(double *)(lVar3 + 0x20 + lVar8),*(double *)(lVar3 + 0x18 + lVar8));
      dVar9 = dVar9 * (double)n_order;
      dVar10 = cos(dVar9);
      local_50 = local_50 + dVar10;
      dVar9 = sin(dVar9);
      local_48 = local_48 + dVar9;
    }
  }
  dVar9 = atan2(local_48,local_50);
  this->psi_ref = dVar9 / (double)n_order;
  return;
}

Assistant:

void HBT_correlation::calculate_flow_event_plane_angle(int n_order) {
    int nev = particle_list->get_number_of_events();
    double vn_real = 0.0;
    double vn_imag = 0.0;
    for (int iev = 0; iev < nev; iev++) {
        int event_number_particle =
            (particle_list->get_number_of_particles(iev));
        for (int i = 0; i < event_number_particle; i++) {
            double temp_px = particle_list->get_particle(iev, i).px;
            double temp_py = particle_list->get_particle(iev, i).py;
            double temp_phi = atan2(temp_py, temp_px);
            vn_real += cos(n_order * temp_phi);
            vn_imag += sin(n_order * temp_phi);
        }
    }
    psi_ref = atan2(vn_imag, vn_real) / n_order;
}